

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_horizontal_6_dual_sse2
               (uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0,uchar *_blimit1,
               uchar *_limit1,uchar *_thresh1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  undefined1 auVar66 [15];
  unkuint9 Var67;
  undefined1 auVar68 [11];
  undefined1 auVar69 [15];
  unkuint9 Var70;
  undefined1 auVar71 [11];
  undefined1 auVar72 [15];
  unkuint9 Var73;
  undefined1 auVar74 [11];
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [11];
  undefined1 auVar78 [15];
  unkuint9 Var79;
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  unkuint9 Var82;
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  long lVar95;
  undefined1 auVar96 [16];
  ushort uVar97;
  ushort uVar99;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  ushort uVar103;
  undefined1 auVar98 [16];
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  ushort uVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  short sVar124;
  ushort uVar125;
  ushort uVar126;
  ushort uVar127;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  short sVar132;
  ushort uVar133;
  short sVar134;
  ushort uVar135;
  short sVar136;
  ushort uVar137;
  short sVar138;
  ushort uVar139;
  short sVar140;
  ushort uVar141;
  short sVar142;
  ushort uVar143;
  undefined1 auVar131 [16];
  ushort uVar144;
  byte bVar145;
  byte bVar147;
  byte bVar148;
  byte bVar149;
  byte bVar150;
  byte bVar151;
  byte bVar152;
  byte bVar153;
  undefined1 auVar146 [16];
  ushort uVar154;
  ushort uVar158;
  ushort uVar159;
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  ushort uVar164;
  undefined1 auVar157 [16];
  ushort uVar165;
  short sVar167;
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined4 uVar169;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  byte bVar182;
  byte bVar184;
  byte bVar185;
  byte bVar186;
  byte bVar187;
  byte bVar188;
  byte bVar189;
  byte bVar190;
  byte bVar191;
  byte bVar192;
  byte bVar193;
  byte bVar194;
  byte bVar195;
  byte bVar196;
  byte bVar197;
  byte bVar198;
  byte bVar199;
  byte bVar200;
  byte bVar201;
  byte bVar202;
  byte bVar203;
  byte bVar204;
  undefined1 auVar183 [16];
  byte bVar205;
  byte bVar206;
  byte bVar207;
  byte bVar211;
  byte bVar213;
  byte bVar215;
  byte bVar217;
  byte bVar219;
  byte bVar221;
  byte bVar223;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar235 [16];
  undefined8 uVar170;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  byte bVar208;
  byte bVar212;
  byte bVar214;
  byte bVar216;
  byte bVar218;
  byte bVar220;
  byte bVar222;
  byte bVar224;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  
  bVar182 = *_blimit0;
  bVar184 = _blimit0[1];
  bVar185 = _blimit0[2];
  bVar186 = _blimit0[3];
  bVar187 = _blimit0[4];
  bVar188 = _blimit0[5];
  bVar189 = _blimit0[6];
  bVar190 = _blimit0[7];
  bVar191 = *_blimit1;
  bVar193 = _blimit1[1];
  bVar195 = _blimit1[2];
  bVar197 = _blimit1[3];
  bVar199 = _blimit1[4];
  bVar201 = _blimit1[5];
  bVar203 = _blimit1[6];
  bVar205 = _blimit1[7];
  bVar50 = *_limit0;
  bVar51 = _limit0[1];
  bVar52 = _limit0[2];
  bVar53 = _limit0[3];
  bVar54 = _limit0[4];
  bVar55 = _limit0[5];
  bVar56 = _limit0[6];
  bVar57 = _limit0[7];
  bVar58 = *_limit1;
  bVar59 = _limit1[1];
  bVar60 = _limit1[2];
  bVar61 = _limit1[3];
  bVar62 = _limit1[4];
  bVar63 = _limit1[5];
  bVar64 = _limit1[6];
  bVar65 = _limit1[7];
  bVar194 = *_thresh0;
  bVar192 = _thresh0[1];
  bVar206 = _thresh0[2];
  bVar204 = _thresh0[3];
  bVar202 = *_thresh1;
  bVar198 = _thresh1[1];
  bVar200 = _thresh1[2];
  bVar196 = _thresh1[3];
  lVar95 = (long)p;
  uVar1 = *(ulong *)(s + lVar95 * -2);
  uVar2 = *(ulong *)(s + -lVar95);
  uVar6 = *(ulong *)s;
  uVar3 = *(ulong *)(s + lVar95 * 2);
  auVar131._8_8_ = uVar3;
  auVar131._0_8_ = *(undefined8 *)(s + -(long)(p * 3));
  uVar4 = *(ulong *)(s + lVar95);
  auVar183._8_8_ = uVar4;
  auVar183._0_8_ = uVar1;
  auVar146._8_8_ = uVar6;
  auVar146._0_8_ = uVar2;
  auVar168._8_8_ = uVar1;
  auVar168._0_8_ = uVar2;
  auVar96._8_4_ = (int)uVar4;
  auVar96._0_8_ = uVar6;
  auVar96._12_4_ = (int)(uVar4 >> 0x20);
  auVar209 = psubusb(auVar183,auVar146);
  auVar166 = psubusb(auVar146,auVar183);
  auVar166 = auVar166 | auVar209;
  auVar209 = psubusb(auVar168,auVar96);
  auVar225 = psubusb(auVar96,auVar168);
  auVar225 = auVar225 | auVar209;
  bVar145 = auVar166[0];
  bVar208 = auVar166[8];
  bVar207 = (bVar208 < bVar145) * bVar145 | (bVar208 >= bVar145) * bVar208;
  bVar147 = auVar166[1];
  bVar212 = auVar166[9];
  bVar211 = (bVar212 < bVar147) * bVar147 | (bVar212 >= bVar147) * bVar212;
  bVar148 = auVar166[2];
  bVar214 = auVar166[10];
  bVar213 = (bVar214 < bVar148) * bVar148 | (bVar214 >= bVar148) * bVar214;
  bVar149 = auVar166[3];
  bVar216 = auVar166[0xb];
  bVar215 = (bVar216 < bVar149) * bVar149 | (bVar216 >= bVar149) * bVar216;
  bVar150 = auVar166[4];
  bVar218 = auVar166[0xc];
  bVar217 = (bVar218 < bVar150) * bVar150 | (bVar218 >= bVar150) * bVar218;
  bVar151 = auVar166[5];
  bVar220 = auVar166[0xd];
  bVar219 = (bVar220 < bVar151) * bVar151 | (bVar220 >= bVar151) * bVar220;
  bVar152 = auVar166[6];
  bVar222 = auVar166[0xe];
  bVar221 = (bVar222 < bVar152) * bVar152 | (bVar222 >= bVar152) * bVar222;
  bVar153 = auVar166[7];
  bVar224 = auVar166[0xf];
  bVar223 = (bVar224 < bVar153) * bVar153 | (bVar224 >= bVar153) * bVar224;
  uVar169 = CONCAT13(-((byte)((bVar215 < bVar204) * bVar215 | (bVar215 >= bVar204) * bVar204) ==
                      bVar215),
                     CONCAT12(-((byte)((bVar213 < bVar206) * bVar213 |
                                      (bVar213 >= bVar206) * bVar206) == bVar213),
                              CONCAT11(-((byte)((bVar211 < bVar192) * bVar211 |
                                               (bVar211 >= bVar192) * bVar192) == bVar211),
                                       -((byte)((bVar207 < bVar194) * bVar207 |
                                               (bVar207 >= bVar194) * bVar194) == bVar207))));
  uVar170 = CONCAT17(-((byte)((bVar223 < bVar196) * bVar223 | (bVar223 >= bVar196) * bVar196) ==
                      bVar223),
                     CONCAT16(-((byte)((bVar221 < bVar200) * bVar221 |
                                      (bVar221 >= bVar200) * bVar200) == bVar221),
                              CONCAT15(-((byte)((bVar219 < bVar198) * bVar219 |
                                               (bVar219 >= bVar198) * bVar198) == bVar219),
                                       CONCAT14(-((byte)((bVar217 < bVar202) * bVar217 |
                                                        (bVar217 >= bVar202) * bVar202) == bVar217),
                                                uVar169))));
  auVar210._8_8_ = 0;
  auVar210._0_8_ = auVar225._0_8_;
  auVar166 = paddusb(auVar210,auVar210);
  auVar226._0_2_ = auVar225._8_2_ >> 1;
  auVar226._2_2_ = auVar225._10_2_ >> 1;
  auVar226._4_2_ = auVar225._12_2_ >> 1;
  auVar226._6_2_ = auVar225._14_2_ >> 1;
  auVar226._8_8_ = 0;
  auVar209 = paddusb(auVar226 & _DAT_00beb0d0,auVar166);
  auVar166._8_4_ = uVar169;
  auVar166._0_8_ = uVar170;
  auVar166._12_4_ = (int)((ulong)uVar170 >> 0x20);
  bVar194 = auVar209[0];
  bVar192 = auVar209[1];
  bVar206 = auVar209[2];
  bVar204 = auVar209[3];
  bVar202 = auVar209[4];
  bVar198 = auVar209[5];
  bVar200 = auVar209[6];
  bVar196 = auVar209[7];
  bVar207 = auVar209[8];
  bVar211 = auVar209[9];
  bVar213 = auVar209[10];
  bVar215 = auVar209[0xb];
  bVar217 = auVar209[0xc];
  bVar219 = auVar209[0xd];
  bVar221 = auVar209[0xe];
  bVar223 = auVar209[0xf];
  bVar194 = -((byte)((bVar194 < bVar182) * bVar194 | (bVar194 >= bVar182) * bVar182) == bVar194) ^
            0xff;
  bVar192 = -((byte)((bVar192 < bVar184) * bVar192 | (bVar192 >= bVar184) * bVar184) == bVar192) ^
            0xff;
  bVar206 = -((byte)((bVar206 < bVar185) * bVar206 | (bVar206 >= bVar185) * bVar185) == bVar206) ^
            0xff;
  bVar204 = -((byte)((bVar204 < bVar186) * bVar204 | (bVar204 >= bVar186) * bVar186) == bVar204) ^
            0xff;
  bVar202 = -((byte)((bVar202 < bVar191) * bVar202 | (bVar202 >= bVar191) * bVar191) == bVar202) ^
            0xff;
  bVar198 = -((byte)((bVar198 < bVar193) * bVar198 | (bVar198 >= bVar193) * bVar193) == bVar198) ^
            0xff;
  bVar200 = -((byte)((bVar200 < bVar195) * bVar200 | (bVar200 >= bVar195) * bVar195) == bVar200) ^
            0xff;
  bVar196 = -((byte)((bVar196 < bVar197) * bVar196 | (bVar196 >= bVar197) * bVar197) == bVar196) ^
            0xff;
  bVar207 = -((byte)((bVar207 < bVar187) * bVar207 | (bVar207 >= bVar187) * bVar187) == bVar207) ^
            0xff;
  bVar211 = -((byte)((bVar211 < bVar188) * bVar211 | (bVar211 >= bVar188) * bVar188) == bVar211) ^
            0xff;
  bVar213 = -((byte)((bVar213 < bVar189) * bVar213 | (bVar213 >= bVar189) * bVar189) == bVar213) ^
            0xff;
  bVar215 = -((byte)((bVar215 < bVar190) * bVar215 | (bVar215 >= bVar190) * bVar190) == bVar215) ^
            0xff;
  bVar217 = -((byte)((bVar217 < bVar199) * bVar217 | (bVar217 >= bVar199) * bVar199) == bVar217) ^
            0xff;
  bVar219 = -((byte)((bVar219 < bVar201) * bVar219 | (bVar219 >= bVar201) * bVar201) == bVar219) ^
            0xff;
  bVar221 = -((byte)((bVar221 < bVar203) * bVar221 | (bVar221 >= bVar203) * bVar203) == bVar221) ^
            0xff;
  bVar223 = -((byte)((bVar223 < bVar205) * bVar223 | (bVar223 >= bVar205) * bVar205) == bVar223) ^
            0xff;
  auVar225 = psubusb(auVar131,auVar183);
  auVar209 = psubusb(auVar183,auVar131);
  auVar209 = auVar209 | auVar225;
  bVar182 = auVar209[0];
  bVar182 = (bVar182 < bVar145) * bVar145 | (bVar182 >= bVar145) * bVar182;
  bVar184 = auVar209[1];
  bVar184 = (bVar184 < bVar147) * bVar147 | (bVar184 >= bVar147) * bVar184;
  bVar185 = auVar209[2];
  bVar185 = (bVar185 < bVar148) * bVar148 | (bVar185 >= bVar148) * bVar185;
  bVar186 = auVar209[3];
  bVar186 = (bVar186 < bVar149) * bVar149 | (bVar186 >= bVar149) * bVar186;
  bVar187 = auVar209[4];
  bVar187 = (bVar187 < bVar150) * bVar150 | (bVar187 >= bVar150) * bVar187;
  bVar188 = auVar209[5];
  bVar188 = (bVar188 < bVar151) * bVar151 | (bVar188 >= bVar151) * bVar188;
  bVar189 = auVar209[6];
  bVar189 = (bVar189 < bVar152) * bVar152 | (bVar189 >= bVar152) * bVar189;
  bVar190 = auVar209[7];
  bVar190 = (bVar190 < bVar153) * bVar153 | (bVar190 >= bVar153) * bVar190;
  bVar191 = auVar209[8];
  bVar191 = (bVar191 < bVar208) * bVar208 | (bVar191 >= bVar208) * bVar191;
  bVar193 = auVar209[9];
  bVar193 = (bVar193 < bVar212) * bVar212 | (bVar193 >= bVar212) * bVar193;
  bVar195 = auVar209[10];
  bVar195 = (bVar195 < bVar214) * bVar214 | (bVar195 >= bVar214) * bVar195;
  bVar197 = auVar209[0xb];
  bVar197 = (bVar197 < bVar216) * bVar216 | (bVar197 >= bVar216) * bVar197;
  bVar199 = auVar209[0xc];
  bVar199 = (bVar199 < bVar218) * bVar218 | (bVar199 >= bVar218) * bVar199;
  bVar201 = auVar209[0xd];
  bVar201 = (bVar201 < bVar220) * bVar220 | (bVar201 >= bVar220) * bVar201;
  bVar203 = auVar209[0xe];
  bVar205 = auVar209[0xf];
  bVar203 = (bVar203 < bVar222) * bVar222 | (bVar203 >= bVar222) * bVar203;
  bVar205 = (bVar205 < bVar224) * bVar224 | (bVar205 >= bVar224) * bVar205;
  bVar182 = (bVar182 < bVar194) * bVar194 | (bVar182 >= bVar194) * bVar182;
  bVar184 = (bVar184 < bVar192) * bVar192 | (bVar184 >= bVar192) * bVar184;
  bVar185 = (bVar185 < bVar206) * bVar206 | (bVar185 >= bVar206) * bVar185;
  bVar186 = (bVar186 < bVar204) * bVar204 | (bVar186 >= bVar204) * bVar186;
  bVar187 = (bVar187 < bVar202) * bVar202 | (bVar187 >= bVar202) * bVar187;
  bVar188 = (bVar188 < bVar198) * bVar198 | (bVar188 >= bVar198) * bVar188;
  bVar189 = (bVar189 < bVar200) * bVar200 | (bVar189 >= bVar200) * bVar189;
  bVar190 = (bVar190 < bVar196) * bVar196 | (bVar190 >= bVar196) * bVar190;
  bVar192 = (bVar191 < bVar207) * bVar207 | (bVar191 >= bVar207) * bVar191;
  bVar194 = (bVar193 < bVar211) * bVar211 | (bVar193 >= bVar211) * bVar193;
  bVar196 = (bVar195 < bVar213) * bVar213 | (bVar195 >= bVar213) * bVar195;
  bVar198 = (bVar197 < bVar215) * bVar215 | (bVar197 >= bVar215) * bVar197;
  bVar200 = (bVar199 < bVar217) * bVar217 | (bVar199 >= bVar217) * bVar199;
  bVar202 = (bVar201 < bVar219) * bVar219 | (bVar201 >= bVar219) * bVar201;
  bVar204 = (bVar203 < bVar221) * bVar221 | (bVar203 >= bVar221) * bVar203;
  bVar206 = (bVar205 < bVar223) * bVar223 | (bVar205 >= bVar223) * bVar205;
  bVar207 = (bVar192 < bVar182) * bVar182 | (bVar192 >= bVar182) * bVar192;
  bVar211 = (bVar194 < bVar184) * bVar184 | (bVar194 >= bVar184) * bVar194;
  bVar213 = (bVar196 < bVar185) * bVar185 | (bVar196 >= bVar185) * bVar196;
  bVar215 = (bVar198 < bVar186) * bVar186 | (bVar198 >= bVar186) * bVar198;
  bVar217 = (bVar200 < bVar187) * bVar187 | (bVar200 >= bVar187) * bVar200;
  bVar219 = (bVar202 < bVar188) * bVar188 | (bVar202 >= bVar188) * bVar202;
  bVar221 = (bVar204 < bVar189) * bVar189 | (bVar204 >= bVar189) * bVar204;
  bVar223 = (bVar206 < bVar190) * bVar190 | (bVar206 >= bVar190) * bVar206;
  bVar192 = (bVar192 != 0) * bVar192;
  bVar194 = (bVar194 != 0) * bVar194;
  bVar196 = (bVar196 != 0) * bVar196;
  bVar198 = (bVar198 != 0) * bVar198;
  bVar200 = (bVar200 != 0) * bVar200;
  bVar202 = (bVar202 != 0) * bVar202;
  bVar204 = (bVar204 != 0) * bVar204;
  bVar206 = (bVar206 != 0) * bVar206;
  auVar225[0] = -((byte)((bVar207 < bVar50) * bVar207 | (bVar207 >= bVar50) * bVar50) == bVar207);
  auVar225[1] = -((byte)((bVar211 < bVar51) * bVar211 | (bVar211 >= bVar51) * bVar51) == bVar211);
  auVar225[2] = -((byte)((bVar213 < bVar52) * bVar213 | (bVar213 >= bVar52) * bVar52) == bVar213);
  auVar225[3] = -((byte)((bVar215 < bVar53) * bVar215 | (bVar215 >= bVar53) * bVar53) == bVar215);
  auVar225[4] = -((byte)((bVar217 < bVar58) * bVar217 | (bVar217 >= bVar58) * bVar58) == bVar217);
  auVar225[5] = -((byte)((bVar219 < bVar59) * bVar219 | (bVar219 >= bVar59) * bVar59) == bVar219);
  auVar225[6] = -((byte)((bVar221 < bVar60) * bVar221 | (bVar221 >= bVar60) * bVar60) == bVar221);
  auVar225[7] = -((byte)((bVar223 < bVar61) * bVar223 | (bVar223 >= bVar61) * bVar61) == bVar223);
  auVar225[8] = -((byte)((bVar192 < bVar54) * bVar192 | (bVar192 >= bVar54) * bVar54) == bVar192);
  auVar225[9] = -((byte)((bVar194 < bVar55) * bVar194 | (bVar194 >= bVar55) * bVar55) == bVar194);
  auVar225[10] = -((byte)((bVar196 < bVar56) * bVar196 | (bVar196 >= bVar56) * bVar56) == bVar196);
  auVar225[0xb] = -((byte)((bVar198 < bVar57) * bVar198 | (bVar198 >= bVar57) * bVar57) == bVar198);
  auVar225[0xc] = -((byte)((bVar200 < bVar62) * bVar200 | (bVar200 >= bVar62) * bVar62) == bVar200);
  auVar225[0xd] = -((byte)((bVar202 < bVar63) * bVar202 | (bVar202 >= bVar63) * bVar63) == bVar202);
  auVar225[0xe] = -((byte)((bVar204 < bVar64) * bVar204 | (bVar204 >= bVar64) * bVar64) == bVar204);
  auVar225[0xf] = -((byte)((bVar206 < bVar65) * bVar206 | (bVar206 >= bVar65) * bVar65) == bVar206);
  auVar209 = psubsb(auVar168 ^ _DAT_00beb160,auVar96 ^ _DAT_00beb160);
  auVar171 = psubsb(~auVar166 & auVar209 >> 0x40,auVar209);
  auVar171 = psubsb(auVar171,auVar209);
  auVar172 = psubsb(auVar171,auVar209);
  auVar172 = auVar172 & auVar225;
  auVar156._0_8_ = auVar172._0_8_;
  auVar156._8_4_ = auVar172._0_4_;
  auVar156._12_4_ = auVar172._4_4_;
  auVar171 = paddsb(auVar156,_DAT_00d129a0);
  auVar173[1] = auVar171[8];
  auVar173[0] = auVar172[8];
  auVar173[2] = auVar172[9];
  auVar173[3] = auVar171[9];
  auVar173[4] = auVar172[10];
  auVar173[5] = auVar171[10];
  auVar173[6] = auVar172[0xb];
  auVar173[7] = auVar171[0xb];
  auVar173[8] = auVar172[0xc];
  auVar173[9] = auVar171[0xc];
  auVar173[10] = auVar172[0xd];
  auVar173[0xb] = auVar171[0xd];
  auVar173[0xc] = auVar172[0xe];
  auVar173[0xd] = auVar171[0xe];
  auVar173[0xe] = auVar172[0xf];
  auVar173[0xf] = auVar171[0xf];
  uVar5 = auVar209._8_8_;
  auVar234._8_6_ = 0;
  auVar234._0_8_ = uVar5;
  auVar234[0xe] = auVar209[0xf];
  auVar234[0xf] = auVar171[7];
  auVar233._14_2_ = auVar234._14_2_;
  auVar233._8_5_ = 0;
  auVar233._0_8_ = uVar5;
  auVar233[0xd] = auVar171[6];
  auVar232._13_3_ = auVar233._13_3_;
  auVar232._8_4_ = 0;
  auVar232._0_8_ = uVar5;
  auVar232[0xc] = auVar209[0xe];
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._8_3_ = 0;
  auVar231._0_8_ = uVar5;
  auVar231[0xb] = auVar171[5];
  auVar230._11_5_ = auVar231._11_5_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar5;
  auVar230[10] = auVar209[0xd];
  auVar229._10_6_ = auVar230._10_6_;
  auVar229[8] = 0;
  auVar229._0_8_ = uVar5;
  auVar229[9] = auVar171[4];
  auVar228._9_7_ = auVar229._9_7_;
  auVar228[8] = auVar209[0xc];
  auVar228._0_8_ = uVar5;
  auVar227._8_8_ = auVar228._8_8_;
  auVar227[7] = auVar171[3];
  auVar227[6] = auVar209[0xb];
  auVar227[5] = auVar171[2];
  auVar227[4] = auVar209[10];
  auVar227[3] = auVar171[1];
  auVar227[2] = auVar209[9];
  auVar227[0] = auVar209[8];
  auVar227[1] = auVar171[0];
  auVar171 = psraw(auVar227,0xb);
  auVar209 = psraw(auVar173,0xb);
  auVar171 = packsswb(auVar171,auVar209);
  auVar181._0_14_ = auVar209._0_14_;
  auVar181[0xe] = auVar209[7];
  auVar181[0xf] = auVar171[7] + '\x01';
  auVar180._14_2_ = auVar181._14_2_;
  auVar180._0_13_ = auVar209._0_13_;
  auVar180[0xd] = auVar171[6] + '\x01';
  auVar179._13_3_ = auVar180._13_3_;
  auVar179._0_12_ = auVar209._0_12_;
  auVar179[0xc] = auVar209[6];
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._0_11_ = auVar209._0_11_;
  auVar178[0xb] = auVar171[5] + '\x01';
  auVar177._11_5_ = auVar178._11_5_;
  auVar177._0_10_ = auVar209._0_10_;
  auVar177[10] = auVar209[5];
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._0_9_ = auVar209._0_9_;
  auVar176[9] = auVar171[4] + '\x01';
  auVar175._9_7_ = auVar176._9_7_;
  auVar175._0_8_ = auVar209._0_8_;
  auVar175[8] = auVar209[4];
  auVar174._8_8_ = auVar175._8_8_;
  auVar174[7] = auVar171[3] + '\x01';
  auVar174[6] = auVar209[3];
  auVar174[5] = auVar171[2] + '\x01';
  auVar174[4] = auVar209[2];
  auVar174[3] = auVar171[1] + '\x01';
  auVar174[2] = auVar209[1];
  auVar174[0] = auVar209[0];
  auVar174[1] = auVar171[0] + '\x01';
  auVar209 = psraw(auVar174,9);
  auVar209 = packsswb(auVar209,auVar209);
  auVar155._8_8_ = SUB168(auVar209 & auVar166,8);
  auVar155._0_8_ = auVar171._8_8_;
  auVar235._0_8_ = auVar171._0_8_;
  auVar235._8_8_ = SUB168(auVar209 & auVar166,0);
  auVar96 = psubsb(auVar96 ^ _DAT_00beb160,auVar235);
  auVar156 = paddsb(auVar155,auVar168 ^ _DAT_00beb160);
  auVar96 = auVar96 ^ _DAT_00beb160;
  auVar156 = auVar156 ^ _DAT_00beb160;
  auVar166 = psubusb(auVar131,auVar146);
  auVar209 = psubusb(auVar146,auVar131);
  auVar209 = auVar209 | auVar166;
  bVar194 = auVar209[0];
  bVar145 = (bVar194 < bVar145) * bVar145 | (bVar194 >= bVar145) * bVar194;
  bVar194 = auVar209[1];
  bVar147 = (bVar194 < bVar147) * bVar147 | (bVar194 >= bVar147) * bVar194;
  bVar194 = auVar209[2];
  bVar148 = (bVar194 < bVar148) * bVar148 | (bVar194 >= bVar148) * bVar194;
  bVar194 = auVar209[3];
  bVar149 = (bVar194 < bVar149) * bVar149 | (bVar194 >= bVar149) * bVar194;
  bVar194 = auVar209[4];
  bVar150 = (bVar194 < bVar150) * bVar150 | (bVar194 >= bVar150) * bVar194;
  bVar194 = auVar209[5];
  bVar151 = (bVar194 < bVar151) * bVar151 | (bVar194 >= bVar151) * bVar194;
  bVar194 = auVar209[6];
  bVar152 = (bVar194 < bVar152) * bVar152 | (bVar194 >= bVar152) * bVar194;
  bVar194 = auVar209[7];
  bVar153 = (bVar194 < bVar153) * bVar153 | (bVar194 >= bVar153) * bVar194;
  bVar194 = auVar209[8];
  bVar194 = (bVar194 < bVar208) * bVar208 | (bVar194 >= bVar208) * bVar194;
  bVar192 = auVar209[9];
  bVar200 = (bVar192 < bVar212) * bVar212 | (bVar192 >= bVar212) * bVar192;
  bVar192 = auVar209[10];
  bVar198 = (bVar192 < bVar214) * bVar214 | (bVar192 >= bVar214) * bVar192;
  bVar192 = auVar209[0xb];
  bVar202 = (bVar192 < bVar216) * bVar216 | (bVar192 >= bVar216) * bVar192;
  bVar192 = auVar209[0xc];
  bVar196 = (bVar192 < bVar218) * bVar218 | (bVar192 >= bVar218) * bVar192;
  bVar192 = auVar209[0xd];
  bVar204 = (bVar192 < bVar220) * bVar220 | (bVar192 >= bVar220) * bVar192;
  bVar192 = auVar209[0xe];
  bVar207 = auVar209[0xf];
  bVar206 = (bVar192 < bVar222) * bVar222 | (bVar192 >= bVar222) * bVar192;
  bVar192 = (bVar207 < bVar224) * bVar224 | (bVar207 >= bVar224) * bVar207;
  bVar145 = (bVar194 < bVar145) * bVar145 | (bVar194 >= bVar145) * bVar194;
  bVar147 = (bVar200 < bVar147) * bVar147 | (bVar200 >= bVar147) * bVar200;
  bVar148 = (bVar198 < bVar148) * bVar148 | (bVar198 >= bVar148) * bVar198;
  bVar149 = (bVar202 < bVar149) * bVar149 | (bVar202 >= bVar149) * bVar202;
  bVar150 = (bVar196 < bVar150) * bVar150 | (bVar196 >= bVar150) * bVar196;
  bVar151 = (bVar204 < bVar151) * bVar151 | (bVar204 >= bVar151) * bVar204;
  bVar152 = (bVar206 < bVar152) * bVar152 | (bVar206 >= bVar152) * bVar206;
  bVar153 = (bVar192 < bVar153) * bVar153 | (bVar192 >= bVar153) * bVar192;
  bVar194 = (bVar194 != 0) * bVar194;
  bVar200 = (bVar200 != 0) * bVar200;
  bVar198 = (bVar198 != 0) * bVar198;
  bVar202 = (bVar202 != 0) * bVar202;
  bVar196 = (bVar196 != 0) * bVar196;
  bVar204 = (bVar204 != 0) * bVar204;
  bVar206 = (bVar206 != 0) * bVar206;
  bVar192 = (bVar192 != 0) * bVar192;
  auVar172[0] = -((byte)((bVar145 == 0) * bVar145 | bVar145 != 0) == bVar145);
  auVar172[1] = -((byte)((bVar147 == 0) * bVar147 | bVar147 != 0) == bVar147);
  auVar172[2] = -((byte)((bVar148 == 0) * bVar148 | bVar148 != 0) == bVar148);
  auVar172[3] = -((byte)((bVar149 == 0) * bVar149 | bVar149 != 0) == bVar149);
  auVar172[4] = -((byte)((bVar150 == 0) * bVar150 | bVar150 != 0) == bVar150);
  auVar172[5] = -((byte)((bVar151 == 0) * bVar151 | bVar151 != 0) == bVar151);
  auVar172[6] = -((byte)((bVar152 == 0) * bVar152 | bVar152 != 0) == bVar152);
  auVar172[7] = -((byte)((bVar153 == 0) * bVar153 | bVar153 != 0) == bVar153);
  auVar172[8] = -((byte)((bVar194 == 0) * bVar194 | bVar194 != 0) == bVar194);
  auVar172[9] = -((byte)((bVar200 == 0) * bVar200 | bVar200 != 0) == bVar200);
  auVar172[10] = -((byte)((bVar198 == 0) * bVar198 | bVar198 != 0) == bVar198);
  auVar172[0xb] = -((byte)((bVar202 == 0) * bVar202 | bVar202 != 0) == bVar202);
  auVar172[0xc] = -((byte)((bVar196 == 0) * bVar196 | bVar196 != 0) == bVar196);
  auVar172[0xd] = -((byte)((bVar204 == 0) * bVar204 | bVar204 != 0) == bVar204);
  auVar172[0xe] = -((byte)((bVar206 == 0) * bVar206 | bVar206 != 0) == bVar206);
  auVar172[0xf] = -((byte)((bVar192 == 0) * bVar192 | bVar192 != 0) == bVar192);
  auVar172 = auVar172 & auVar225;
  auVar171._0_8_ = auVar172._0_8_;
  auVar171._8_4_ = auVar172._0_4_;
  auVar171._12_4_ = auVar172._4_4_;
  auVar209[0] = -(auVar172[0] == '\0');
  auVar209[1] = -(auVar172[1] == '\0');
  auVar209[2] = -(auVar172[2] == '\0');
  auVar209[3] = -(auVar172[3] == '\0');
  auVar209[4] = -(auVar172[4] == '\0');
  auVar209[5] = -(auVar172[5] == '\0');
  auVar209[6] = -(auVar172[6] == '\0');
  auVar209[7] = -(auVar172[7] == '\0');
  auVar209[8] = -(auVar172[0] == '\0');
  auVar209[9] = -(auVar172[1] == '\0');
  auVar209[10] = -(auVar172[2] == '\0');
  auVar209[0xb] = -(auVar172[3] == '\0');
  auVar209[0xc] = -(auVar172[4] == '\0');
  auVar209[0xd] = -(auVar172[5] == '\0');
  auVar209[0xe] = -(auVar172[6] == '\0');
  auVar209[0xf] = -(auVar172[7] == '\0');
  if ((ushort)((ushort)(SUB161(auVar209 >> 7,0) & 1) | (ushort)(SUB161(auVar209 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar209 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar209 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar209 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar209 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar209 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar209 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar209 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar209 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar209 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar209 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar209 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar209 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar209 >> 0x77,0) & 1) << 0xe | (ushort)(auVar209[0xf] >> 7) << 0xf
              ) != 0xffff) {
    uVar5 = *(ulong *)(s + -(long)(p * 3));
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar5;
    auVar7[0xe] = (char)(uVar5 >> 0x38);
    auVar13._8_4_ = 0;
    auVar13._0_8_ = uVar5;
    auVar13[0xc] = (char)(uVar5 >> 0x30);
    auVar13._13_2_ = auVar7._13_2_;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar5;
    auVar19._12_3_ = auVar13._12_3_;
    auVar25._8_2_ = 0;
    auVar25._0_8_ = uVar5;
    auVar25[10] = (char)(uVar5 >> 0x28);
    auVar25._11_4_ = auVar19._11_4_;
    auVar31._8_2_ = 0;
    auVar31._0_8_ = uVar5;
    auVar31._10_5_ = auVar25._10_5_;
    auVar37[8] = (char)(uVar5 >> 0x20);
    auVar37._0_8_ = uVar5;
    auVar37._9_6_ = auVar31._9_6_;
    auVar66._7_8_ = 0;
    auVar66._0_7_ = auVar37._8_7_;
    Var67 = CONCAT81(SUB158(auVar66 << 0x40,7),(char)(uVar5 >> 0x18));
    auVar84._9_6_ = 0;
    auVar84._0_9_ = Var67;
    auVar68._1_10_ = SUB1510(auVar84 << 0x30,5);
    auVar68[0] = (char)(uVar5 >> 0x10);
    auVar85._11_4_ = 0;
    auVar85._0_11_ = auVar68;
    auVar44[2] = (char)(uVar5 >> 8);
    auVar44._0_2_ = (ushort)uVar5;
    auVar44._3_12_ = SUB1512(auVar85 << 0x20,3);
    uVar103 = (ushort)uVar5 & 0xff;
    auVar8._8_6_ = 0;
    auVar8._0_8_ = uVar1;
    auVar8[0xe] = (char)(uVar1 >> 0x38);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[0xc] = (char)(uVar1 >> 0x30);
    auVar14._13_2_ = auVar8._13_2_;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = uVar1;
    auVar20._12_3_ = auVar14._12_3_;
    auVar26._8_2_ = 0;
    auVar26._0_8_ = uVar1;
    auVar26[10] = (char)(uVar1 >> 0x28);
    auVar26._11_4_ = auVar20._11_4_;
    auVar32._8_2_ = 0;
    auVar32._0_8_ = uVar1;
    auVar32._10_5_ = auVar26._10_5_;
    auVar38[8] = (char)(uVar1 >> 0x20);
    auVar38._0_8_ = uVar1;
    auVar38._9_6_ = auVar32._9_6_;
    auVar69._7_8_ = 0;
    auVar69._0_7_ = auVar38._8_7_;
    Var70 = CONCAT81(SUB158(auVar69 << 0x40,7),(char)(uVar1 >> 0x18));
    auVar86._9_6_ = 0;
    auVar86._0_9_ = Var70;
    auVar71._1_10_ = SUB1510(auVar86 << 0x30,5);
    auVar71[0] = (char)(uVar1 >> 0x10);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar71;
    auVar45[2] = (char)(uVar1 >> 8);
    auVar45._0_2_ = (ushort)uVar1;
    auVar45._3_12_ = SUB1512(auVar87 << 0x20,3);
    uVar165 = (ushort)uVar1 & 0xff;
    auVar9._8_6_ = 0;
    auVar9._0_8_ = uVar2;
    auVar9[0xe] = (char)(uVar2 >> 0x38);
    auVar15._8_4_ = 0;
    auVar15._0_8_ = uVar2;
    auVar15[0xc] = (char)(uVar2 >> 0x30);
    auVar15._13_2_ = auVar9._13_2_;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = uVar2;
    auVar21._12_3_ = auVar15._12_3_;
    auVar27._8_2_ = 0;
    auVar27._0_8_ = uVar2;
    auVar27[10] = (char)(uVar2 >> 0x28);
    auVar27._11_4_ = auVar21._11_4_;
    auVar33._8_2_ = 0;
    auVar33._0_8_ = uVar2;
    auVar33._10_5_ = auVar27._10_5_;
    auVar39[8] = (char)(uVar2 >> 0x20);
    auVar39._0_8_ = uVar2;
    auVar39._9_6_ = auVar33._9_6_;
    auVar72._7_8_ = 0;
    auVar72._0_7_ = auVar39._8_7_;
    Var73 = CONCAT81(SUB158(auVar72 << 0x40,7),(char)(uVar2 >> 0x18));
    auVar88._9_6_ = 0;
    auVar88._0_9_ = Var73;
    auVar74._1_10_ = SUB1510(auVar88 << 0x30,5);
    auVar74[0] = (char)(uVar2 >> 0x10);
    auVar89._11_4_ = 0;
    auVar89._0_11_ = auVar74;
    auVar46[2] = (char)(uVar2 >> 8);
    auVar46._0_2_ = (ushort)uVar2;
    auVar46._3_12_ = SUB1512(auVar89 << 0x20,3);
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar6;
    auVar10[0xe] = (char)(uVar6 >> 0x38);
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar6;
    auVar16[0xc] = (char)(uVar6 >> 0x30);
    auVar16._13_2_ = auVar10._13_2_;
    auVar22._8_4_ = 0;
    auVar22._0_8_ = uVar6;
    auVar22._12_3_ = auVar16._12_3_;
    auVar28._8_2_ = 0;
    auVar28._0_8_ = uVar6;
    auVar28[10] = (char)(uVar6 >> 0x28);
    auVar28._11_4_ = auVar22._11_4_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = uVar6;
    auVar34._10_5_ = auVar28._10_5_;
    auVar40[8] = (char)(uVar6 >> 0x20);
    auVar40._0_8_ = uVar6;
    auVar40._9_6_ = auVar34._9_6_;
    auVar75._7_8_ = 0;
    auVar75._0_7_ = auVar40._8_7_;
    Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),(char)(uVar6 >> 0x18));
    auVar90._9_6_ = 0;
    auVar90._0_9_ = Var76;
    auVar77._1_10_ = SUB1510(auVar90 << 0x30,5);
    auVar77[0] = (char)(uVar6 >> 0x10);
    auVar91._11_4_ = 0;
    auVar91._0_11_ = auVar77;
    auVar47[2] = (char)(uVar6 >> 8);
    auVar47._0_2_ = (ushort)uVar6;
    auVar47._3_12_ = SUB1512(auVar91 << 0x20,3);
    uVar121 = (ushort)uVar6 & 0xff;
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar4;
    auVar11[0xe] = (char)(uVar4 >> 0x38);
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar4;
    auVar17[0xc] = (char)(uVar4 >> 0x30);
    auVar17._13_2_ = auVar11._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = uVar4;
    auVar23._12_3_ = auVar17._12_3_;
    auVar29._8_2_ = 0;
    auVar29._0_8_ = uVar4;
    auVar29[10] = (char)(uVar4 >> 0x28);
    auVar29._11_4_ = auVar23._11_4_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar4;
    auVar35._10_5_ = auVar29._10_5_;
    auVar41[8] = (char)(uVar4 >> 0x20);
    auVar41._0_8_ = uVar4;
    auVar41._9_6_ = auVar35._9_6_;
    auVar78._7_8_ = 0;
    auVar78._0_7_ = auVar41._8_7_;
    Var79 = CONCAT81(SUB158(auVar78 << 0x40,7),(char)(uVar4 >> 0x18));
    auVar92._9_6_ = 0;
    auVar92._0_9_ = Var79;
    auVar43[4] = (char)(uVar4 >> 0x10);
    auVar43._0_4_ = (int)uVar4;
    auVar43._5_10_ = SUB1510(auVar92 << 0x30,5);
    auVar80._11_4_ = 0;
    auVar80._0_11_ = auVar43._4_11_;
    auVar48[2] = (char)(uVar4 >> 8);
    auVar48._0_2_ = (ushort)uVar4;
    auVar48._3_12_ = SUB1512(auVar80 << 0x20,3);
    uVar102 = (ushort)uVar4 & 0xff;
    auVar12._8_6_ = 0;
    auVar12._0_8_ = uVar3;
    auVar12[0xe] = (char)(uVar3 >> 0x38);
    auVar18._8_4_ = 0;
    auVar18._0_8_ = uVar3;
    auVar18[0xc] = (char)(uVar3 >> 0x30);
    auVar18._13_2_ = auVar12._13_2_;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar3;
    auVar24._12_3_ = auVar18._12_3_;
    auVar30._8_2_ = 0;
    auVar30._0_8_ = uVar3;
    auVar30[10] = (char)(uVar3 >> 0x28);
    auVar30._11_4_ = auVar24._11_4_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = uVar3;
    auVar36._10_5_ = auVar30._10_5_;
    auVar42[8] = (char)(uVar3 >> 0x20);
    auVar42._0_8_ = uVar3;
    auVar42._9_6_ = auVar36._9_6_;
    auVar81._7_8_ = 0;
    auVar81._0_7_ = auVar42._8_7_;
    Var82 = CONCAT81(SUB158(auVar81 << 0x40,7),(char)(uVar3 >> 0x18));
    auVar93._9_6_ = 0;
    auVar93._0_9_ = Var82;
    auVar83._1_10_ = SUB1510(auVar93 << 0x30,5);
    auVar83[0] = (char)(uVar3 >> 0x10);
    auVar94._11_4_ = 0;
    auVar94._0_11_ = auVar83;
    auVar49[2] = (char)(uVar3 >> 8);
    auVar49._0_2_ = (ushort)uVar3;
    auVar49._3_12_ = SUB1512(auVar94 << 0x20,3);
    uVar112 = (ushort)uVar3 & 0xff;
    sVar113 = ((ushort)uVar2 & 0xff) + uVar165;
    sVar114 = auVar46._2_2_ + auVar45._2_2_;
    sVar115 = auVar74._0_2_ + auVar71._0_2_;
    sVar167 = (short)Var70;
    sVar116 = (short)Var73 + sVar167;
    sVar117 = auVar39._8_2_ + auVar38._8_2_;
    sVar118 = auVar27._10_2_ + auVar26._10_2_;
    sVar119 = auVar15._12_2_ + auVar14._12_2_;
    uVar97 = auVar8._13_2_ >> 8;
    sVar120 = (auVar9._13_2_ >> 8) + uVar97;
    sVar132 = auVar44._2_2_;
    sVar134 = auVar68._0_2_;
    sVar136 = (short)Var67;
    sVar138 = auVar37._8_2_;
    sVar140 = auVar25._10_2_;
    sVar142 = auVar13._12_2_;
    uVar99 = auVar7._13_2_ >> 8;
    sVar104 = sVar113 * 2 + uVar103 + 4;
    sVar105 = sVar114 * 2 + sVar132 + 4;
    sVar106 = sVar115 * 2 + sVar134 + 4;
    sVar107 = sVar116 * 2 + sVar136 + 4;
    sVar108 = sVar117 * 2 + sVar138 + 4;
    sVar109 = sVar118 * 2 + sVar140 + 4;
    sVar110 = sVar119 * 2 + sVar142 + 4;
    sVar111 = sVar120 * 2 + uVar99 + 4;
    sVar124 = (short)Var76;
    uVar154 = auVar10._13_2_ >> 8;
    uVar130 = (ushort)(uVar103 * 2 + uVar121 + sVar104) >> 3;
    uVar133 = (ushort)(sVar132 * 2 + auVar47._2_2_ + sVar105) >> 3;
    uVar135 = (ushort)(sVar134 * 2 + auVar77._0_2_ + sVar106) >> 3;
    uVar137 = (ushort)(sVar136 * 2 + sVar124 + sVar107) >> 3;
    uVar139 = (ushort)(sVar138 * 2 + auVar40._8_2_ + sVar108) >> 3;
    uVar141 = (ushort)(sVar140 * 2 + auVar28._10_2_ + sVar109) >> 3;
    uVar143 = (ushort)(sVar142 * 2 + auVar16._12_2_ + sVar110) >> 3;
    uVar144 = (ushort)(uVar99 * 2 + uVar154 + sVar111) >> 3;
    sVar101 = (short)Var79;
    uVar100 = auVar11._13_2_ >> 8;
    uVar121 = uVar121 * 2 + uVar102 + sVar104;
    uVar122 = auVar47._2_2_ * 2 + auVar48._2_2_ + sVar105;
    uVar123 = auVar77._0_2_ * 2 + auVar43._4_2_ + sVar106;
    uVar125 = sVar124 * 2 + sVar101 + sVar107;
    uVar126 = auVar40._8_2_ * 2 + auVar41._8_2_ + sVar108;
    uVar127 = auVar28._10_2_ * 2 + auVar29._10_2_ + sVar109;
    uVar128 = auVar16._12_2_ * 2 + auVar17._12_2_ + sVar110;
    uVar129 = uVar154 * 2 + uVar100 + sVar111;
    uVar154 = uVar121 >> 3;
    uVar158 = uVar122 >> 3;
    uVar159 = uVar123 >> 3;
    uVar160 = uVar125 >> 3;
    uVar161 = uVar126 >> 3;
    uVar162 = uVar127 >> 3;
    uVar163 = uVar128 >> 3;
    uVar164 = uVar129 >> 3;
    auVar157[1] = (uVar158 != 0) * (uVar158 < 0x100) * (char)uVar158 - (0xff < uVar158);
    auVar157[0] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar157[2] = (uVar159 != 0) * (uVar159 < 0x100) * (char)uVar159 - (0xff < uVar159);
    auVar157[3] = (uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 - (0xff < uVar160);
    auVar157[4] = (uVar161 != 0) * (uVar161 < 0x100) * (char)uVar161 - (0xff < uVar161);
    auVar157[5] = (uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162);
    auVar157[6] = (uVar163 != 0) * (uVar163 < 0x100) * (char)uVar163 - (0xff < uVar163);
    auVar157[7] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
    auVar157[8] = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
    auVar157[9] = (uVar133 != 0) * (uVar133 < 0x100) * (char)uVar133 - (0xff < uVar133);
    auVar157[10] = (uVar135 != 0) * (uVar135 < 0x100) * (char)uVar135 - (0xff < uVar135);
    auVar157[0xb] = (uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 - (0xff < uVar137);
    auVar157[0xc] = (uVar139 != 0) * (uVar139 < 0x100) * (char)uVar139 - (0xff < uVar139);
    auVar157[0xd] = (uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141);
    auVar157[0xe] = (uVar143 != 0) * (uVar143 < 0x100) * (char)uVar143 - (0xff < uVar143);
    auVar157[0xf] = (uVar144 != 0) * (uVar144 < 0x100) * (char)uVar144 - (0xff < uVar144);
    sVar104 = (short)Var82;
    uVar154 = auVar12._13_2_ >> 8;
    uVar121 = (uVar102 - (uVar165 + uVar103)) + uVar112 + uVar121;
    uVar122 = (auVar48._2_2_ - (auVar45._2_2_ + sVar132)) + auVar49._2_2_ + uVar122;
    uVar123 = (auVar43._4_2_ - (auVar71._0_2_ + sVar134)) + auVar83._0_2_ + uVar123;
    uVar125 = (sVar101 - (sVar167 + sVar136)) + sVar104 + uVar125;
    uVar126 = (auVar41._8_2_ - (auVar38._8_2_ + sVar138)) + auVar42._8_2_ + uVar126;
    uVar127 = (auVar29._10_2_ - (auVar26._10_2_ + sVar140)) + auVar30._10_2_ + uVar127;
    uVar128 = (auVar17._12_2_ - (auVar14._12_2_ + sVar142)) + auVar18._12_2_ + uVar128;
    uVar129 = (uVar100 - (uVar97 + uVar99)) + uVar154 + uVar129;
    uVar97 = uVar121 >> 3;
    uVar99 = uVar122 >> 3;
    uVar100 = uVar123 >> 3;
    uVar102 = uVar125 >> 3;
    uVar103 = uVar126 >> 3;
    uVar130 = uVar127 >> 3;
    uVar133 = uVar128 >> 3;
    uVar135 = uVar129 >> 3;
    uVar121 = (ushort)((uVar112 * 2 - sVar113) + uVar121) >> 3;
    uVar122 = (ushort)((auVar49._2_2_ * 2 - sVar114) + uVar122) >> 3;
    uVar123 = (ushort)((auVar83._0_2_ * 2 - sVar115) + uVar123) >> 3;
    uVar125 = (ushort)((sVar104 * 2 - sVar116) + uVar125) >> 3;
    uVar126 = (ushort)((auVar42._8_2_ * 2 - sVar117) + uVar126) >> 3;
    uVar127 = (ushort)((auVar30._10_2_ * 2 - sVar118) + uVar127) >> 3;
    uVar128 = (ushort)((auVar18._12_2_ * 2 - sVar119) + uVar128) >> 3;
    uVar154 = (ushort)((uVar154 * 2 - sVar120) + uVar129) >> 3;
    auVar98[1] = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    auVar98[0] = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    auVar98[2] = (uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 - (0xff < uVar100);
    auVar98[3] = (uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 - (0xff < uVar102);
    auVar98[4] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
    auVar98[5] = (uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130);
    auVar98[6] = (uVar133 != 0) * (uVar133 < 0x100) * (char)uVar133 - (0xff < uVar133);
    auVar98[7] = (uVar135 != 0) * (uVar135 < 0x100) * (char)uVar135 - (0xff < uVar135);
    auVar98[8] = (uVar121 != 0) * (uVar121 < 0x100) * (char)uVar121 - (0xff < uVar121);
    auVar98[9] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
    auVar98[10] = (uVar123 != 0) * (uVar123 < 0x100) * (char)uVar123 - (0xff < uVar123);
    auVar98[0xb] = (uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125);
    auVar98[0xc] = (uVar126 != 0) * (uVar126 < 0x100) * (char)uVar126 - (0xff < uVar126);
    auVar98[0xd] = (uVar127 != 0) * (uVar127 < 0x100) * (char)uVar127 - (0xff < uVar127);
    auVar98[0xe] = (uVar128 != 0) * (uVar128 < 0x100) * (char)uVar128 - (0xff < uVar128);
    auVar98[0xf] = (uVar154 != 0) * (uVar154 < 0x100) * (char)uVar154 - (0xff < uVar154);
    auVar96 = auVar98 & auVar171 | ~auVar171 & auVar96;
    auVar156 = auVar157 & auVar171 | ~auVar171 & auVar156;
  }
  *(long *)(s + -lVar95) = auVar156._0_8_;
  *(long *)(s + lVar95 * -2) = auVar156._8_8_;
  *(long *)s = auVar96._0_8_;
  *(long *)(s + lVar95) = auVar96._8_8_;
  return;
}

Assistant:

void aom_lpf_horizontal_6_dual_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0,
                                    const unsigned char *_blimit1,
                                    const unsigned char *_limit1,
                                    const unsigned char *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i p2, p1, p0, q0, q1, q2;
  __m128i p1p0, q1q0;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s - 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  lpf_internal_6_dual_sse2(&p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0, &blimit,
                           &limit, &thresh);

  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0);
  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0, 8));
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0, 8));
}